

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_METAL_M3X2(Context *ctx)

{
  size_t in_RCX;
  char *buf;
  char row1 [64];
  char row0 [64];
  char src0 [64];
  char code [256];
  
  buf = src0;
  make_METAL_srcarg_string_vec3(ctx,0,buf,in_RCX);
  make_METAL_srcarg_string_vec3(ctx,1,row0,in_RCX);
  make_METAL_srcarg_string_vec3(ctx,2,row1,in_RCX);
  ctx->metal_need_header_geometric = 1;
  make_METAL_destarg_assign(ctx,code,0x100,"float2(dot(%s, %s), dot(%s, %s))",buf,row0,buf,row1);
  output_line(ctx,"%s",code,buf);
  return;
}

Assistant:

static void emit_METAL_M3X2(Context *ctx)
{
    char src0[64]; make_METAL_srcarg_string_vec3(ctx, 0, src0, sizeof (src0));
    char row0[64]; make_METAL_srcarg_string_vec3(ctx, 1, row0, sizeof (row0));
    char row1[64]; make_METAL_srcarg_string_vec3(ctx, 2, row1, sizeof (row1));
    char code[256];
    ctx->metal_need_header_geometric = 1;
    make_METAL_destarg_assign(ctx, code, sizeof (code),
                                "float2(dot(%s, %s), dot(%s, %s))",
                                src0, row0, src0, row1);
    output_line(ctx, "%s", code);
}